

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchCounter_Test::
CountdownLatchTest_TestCountdownLatchCounter_Test
          (CountdownLatchTest_TestCountdownLatchCounter_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00272688;
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchCounter)
{
    auto latch = new CountdownLatch(5);
    ASSERT_EQ(5, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(4, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(3, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(2, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(1, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
}